

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O1

int compare_zip(char **zn)

{
  undefined8 *puVar1;
  ushort uVar2;
  FILE *pFVar3;
  char **ppcVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  void *pvVar11;
  char *pcVar12;
  FILE *__stream;
  size_t sVar13;
  char *pcVar14;
  int *piVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  void *pvVar19;
  undefined8 uVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  code *check;
  char *pcVar24;
  undefined8 *puVar25;
  long lVar26;
  bool bVar27;
  int err;
  zip_uint64_t n [2];
  archive a [2];
  entry *e [2];
  undefined4 local_20ec;
  char **local_20e8;
  char *local_20e0;
  char *local_20d8;
  char *local_20d0;
  long local_20c0;
  uint local_20a8;
  ushort local_20a4;
  long local_2098 [2];
  char *pcStack_2088;
  void *local_2080 [2];
  size_t local_2070 [3];
  char *local_2058;
  __ino_t local_2050;
  void *local_2048;
  size_t local_2040;
  stat local_2038 [56];
  
  lVar26 = 0;
  local_20e8 = zn;
  do {
    ppcVar4 = local_20e8;
    pcVar22 = local_20e8[lVar26];
    local_2098[lVar26 * 6] = (long)pcVar22;
    local_2098[lVar26 * 6 + 1] = 0;
    (&pcStack_2088)[lVar26 * 6] = (char *)0x0;
    local_2080[lVar26 * 6] = (void *)0x0;
    local_2070[lVar26 * 6 + -1] = 0;
    local_2070[lVar26 * 6] = 0;
    iVar5 = stat(pcVar22,local_2038);
    pcVar22 = ppcVar4[lVar26];
    if ((-1 < iVar5) && ((local_2038[0].st_mode & 0xf000) == 0x4000)) {
      local_20d0 = (char *)0x0;
      local_20d8 = pcVar22;
      lVar8 = fts_open(&local_20d8,6,0);
      if (lVar8 == 0) {
        pcVar24 = "%s: can\'t open directory \'%s\': %s\n";
      }
      else {
        sVar9 = strlen(pcVar22);
        pcVar22 = (char *)0x0;
        while (lVar10 = fts_read(lVar8), lVar10 != 0) {
          uVar2 = *(ushort *)(lVar10 + 0x62);
          bVar27 = true;
          if (uVar2 < 0xe) {
            if ((0x2494U >> (uVar2 & 0x1f) & 1) == 0) {
              if (uVar2 == 8) {
                pcVar24 = (&pcStack_2088)[lVar26 * 6];
                if (pcVar22 <= pcVar24) {
                  pcVar22 = pcVar22 + 0x10;
                  if ((char *)0x492492492492492 < pcVar22) goto LAB_00102d28;
                  pvVar11 = realloc(local_2080[lVar26 * 6],(long)pcVar22 * 0x38);
                  local_2080[lVar26 * 6] = pvVar11;
                  if (pvVar11 == (void *)0x0) goto LAB_00102d28;
                }
                pcVar12 = strdup((char *)(*(long *)(lVar10 + 0x30) + sVar9 + 1));
                pvVar11 = local_2080[lVar26 * 6];
                lVar21 = (long)pcVar24 * 0x38;
                *(char **)((long)pvVar11 + lVar21) = pcVar12;
                *(undefined8 *)((long)pvVar11 + lVar21 + 8) =
                     *(undefined8 *)(*(long *)(lVar10 + 0x68) + 0x30);
                pcVar12 = *(char **)(lVar10 + 0x28);
                lVar10 = crc32(0,0,0);
                __stream = fopen(pcVar12,"rb");
                pFVar3 = _stderr;
                pcVar16 = progname;
                if (__stream == (FILE *)0x0) {
                  piVar15 = __errno_location();
                  pcVar14 = strerror(*piVar15);
                  fprintf(pFVar3,"%s: can\'t open %s: %s\n",pcVar16,pcVar12,pcVar14);
LAB_001027a4:
                  lVar10 = -1;
                }
                else {
                  while (sVar13 = fread(local_2038,1,0x2000,__stream), sVar13 != 0) {
                    lVar10 = crc32(lVar10,local_2038,sVar13 & 0xffffffff);
                  }
                  iVar5 = ferror(__stream);
                  pFVar3 = _stderr;
                  if (iVar5 != 0) {
                    local_20e0 = progname;
                    piVar15 = __errno_location();
                    pcVar16 = strerror(*piVar15);
                    fprintf(pFVar3,"%s: read error on %s: %s\n",local_20e0,pcVar12,pcVar16);
                    fclose(__stream);
                    goto LAB_001027a4;
                  }
                  fclose(__stream);
                }
                if (lVar10 < 0) {
                  fts_close(lVar8);
                }
                else {
                  *(int *)((long)pvVar11 + lVar21 + 0x10) = (int)lVar10;
                  (&pcStack_2088)[lVar26 * 6] = pcVar24 + 1;
                }
                bVar27 = lVar10 >= 0;
              }
            }
            else {
              fts_close(lVar8);
              bVar27 = false;
            }
          }
          if (!bVar27) goto LAB_00102d1e;
        }
        iVar5 = fts_close(lVar8);
        if (iVar5 == 0) {
          paranoid = 0;
          goto LAB_00102c4d;
        }
        pcVar22 = (char *)local_2098[lVar26 * 6];
        pcVar24 = "%s: error closing directory \'%s\': %s\n";
      }
      pFVar3 = _stderr;
      pcVar12 = progname;
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      fprintf(pFVar3,pcVar24,pcVar12,pcVar22,pcVar16);
      goto LAB_00102d1e;
    }
    lVar8 = zip_open(pcVar22,(ulong)(paranoid != 0) << 2,&local_20ec);
    if (lVar8 == 0) {
      zip_error_init_with_code(local_2038,local_20ec);
      pFVar3 = _stderr;
      pcVar24 = progname;
      uVar20 = zip_error_strerror(local_2038);
      fprintf(pFVar3,"%s: cannot open zip archive \'%s\': %s\n",pcVar24,pcVar22,uVar20);
      zip_error_fini(local_2038);
    }
    else {
      local_2098[lVar26 * 6 + 1] = lVar8;
      pcVar22 = (char *)zip_get_num_entries(lVar8,0);
      (&pcStack_2088)[lVar26 * 6] = pcVar22;
      if (pcVar22 != (char *)0x0) {
        if (pcVar22 < (char *)0x492492492492493) {
          pvVar11 = malloc((long)pcVar22 * 0x38);
          local_2080[lVar26 * 6] = pvVar11;
          if (pvVar11 != (void *)0x0) {
            pcVar24 = (char *)0x0;
            do {
              zip_stat_index(lVar8,pcVar24,0,&local_20d8);
              pcVar12 = strdup(local_20d0);
              uVar7 = local_20a8;
              lVar10 = local_20c0;
              lVar21 = (long)pcVar24 * 0x38;
              *(char **)((long)pvVar11 + lVar21) = pcVar12;
              *(long *)((long)pvVar11 + lVar21 + 8) = local_20c0;
              *(uint *)((long)pvVar11 + lVar21 + 0x10) = local_20a8;
              if (test_files != 0) {
                lVar17 = zip_fopen_index(lVar8,pcVar24,0);
                pFVar3 = _stderr;
                pcVar12 = progname;
                if (lVar17 == 0) {
                  uVar20 = zip_strerror(lVar8);
                  fprintf(pFVar3,"%s: cannot open file %lu in archive: %s\n",pcVar12,pcVar24,uVar20)
                  ;
                }
                else {
                  uVar6 = crc32(0,0,0);
                  uVar18 = zip_fread(lVar17,local_2038,0x2000);
                  lVar23 = 0;
                  while (pFVar3 = _stderr, pcVar12 = progname, 0 < (long)uVar18) {
                    lVar23 = lVar23 + uVar18;
                    uVar6 = crc32(uVar6,local_2038,uVar18 & 0xffffffff);
                    uVar18 = zip_fread(lVar17,local_2038,0x2000);
                  }
                  if ((long)uVar18 < 0) {
                    uVar20 = zip_file_strerror(lVar17);
                    fprintf(pFVar3,"%s: error reading file %lu in archive: %s\n",pcVar12,pcVar24,
                            uVar20);
                    zip_fclose(lVar17);
                  }
                  else {
                    zip_fclose(lVar17);
                    if (lVar23 == lVar10) {
                      if (uVar7 != uVar6) {
                        fprintf(_stderr,"%s: file %lu: unexpected length %x (should be %x)\n",
                                progname,pcVar24,(ulong)uVar6);
                      }
                    }
                    else {
                      fprintf(_stderr,"%s: file %lu: unexpected length %ld (should be %ld)\n",
                              progname,pcVar24,lVar23);
                    }
                  }
                }
              }
              if (paranoid == 0) {
                *(undefined4 *)((long)pvVar11 + lVar21 + 0x14) = 0;
                *(undefined2 *)((long)pvVar11 + lVar21 + 0x20) = 0;
              }
              else {
                *(uint *)((long)pvVar11 + lVar21 + 0x14) = (uint)local_20a4;
                uVar7 = zip_file_extra_fields_count(lVar8,pcVar24,0x100);
                if ((-1 < (short)uVar7) &&
                   (iVar5 = zip_file_extra_fields_count(lVar8,pcVar24,0x200), -1 < (short)iVar5)) {
                  puVar25 = (undefined8 *)((long)pvVar11 + lVar21);
                  *(short *)(puVar25 + 4) = (short)(iVar5 + uVar7);
                  pvVar19 = malloc((ulong)((iVar5 + uVar7 & 0xffff) << 3) * 3);
                  puVar25[3] = pvVar19;
                  if (pvVar19 != (void *)0x0) {
                    if ((short)uVar7 == 0) {
                      uVar18 = 0;
                    }
                    else {
                      lVar10 = 0;
                      uVar18 = 0;
                      do {
                        lVar17 = puVar25[3];
                        puVar1 = (undefined8 *)(lVar17 + lVar10);
                        *puVar1 = *puVar25;
                        lVar23 = zip_file_extra_field_get
                                           (lVar8,pcVar24,uVar18 & 0xffff,(long)puVar1 + 10,
                                            lVar17 + 0xc + lVar10);
                        lVar17 = puVar25[3];
                        *(long *)(lVar17 + 0x10 + lVar10) = lVar23;
                        if (lVar23 == 0) goto LAB_00102ac9;
                        *(undefined2 *)(lVar17 + 8 + lVar10) = 0x100;
                        uVar18 = uVar18 + 1;
                        lVar10 = lVar10 + 0x18;
                      } while ((uVar7 & 0xffff) != uVar18);
                    }
                    sVar9 = (size_t)*(ushort *)(puVar25 + 4);
                    if ((ushort)uVar18 < *(ushort *)(puVar25 + 4)) {
                      uVar18 = uVar18 & 0xffff;
                      lVar10 = (ulong)(uint)((int)uVar18 << 3) * 3;
                      do {
                        lVar17 = puVar25[3];
                        puVar1 = (undefined8 *)(lVar17 + lVar10);
                        *puVar1 = *puVar25;
                        lVar23 = zip_file_extra_field_get
                                           (lVar8,pcVar24,(-uVar7 & 0xffff) + (int)uVar18 & 0xffff,
                                            (long)puVar1 + 10,lVar17 + 0xc + lVar10);
                        lVar17 = puVar25[3];
                        *(long *)(lVar17 + 0x10 + lVar10) = lVar23;
                        if (lVar23 == 0) goto LAB_00102ac9;
                        *(undefined2 *)(lVar17 + 8 + lVar10) = 0x200;
                        uVar18 = uVar18 + 1;
                        sVar9 = (size_t)*(ushort *)(puVar25 + 4);
                        lVar10 = lVar10 + 0x18;
                      } while (uVar18 < sVar9);
                    }
                    qsort((void *)puVar25[3],sVar9,0x18,ef_order);
                  }
                }
LAB_00102ac9:
                uVar20 = zip_file_get_comment(lVar8,pcVar24,(long)pvVar11 + lVar21 + 0x30,0);
                *(undefined8 *)((long)pvVar11 + lVar21 + 0x28) = uVar20;
              }
              pcVar24 = (char *)(ulong)((int)pcVar24 + 1);
            } while (pcVar24 < pcVar22);
            if (paranoid == 0) {
              local_2070[lVar26 * 6 + -1] = 0;
              local_2070[lVar26 * 6] = 0;
            }
            else {
              sVar9 = zip_get_archive_comment(lVar8,local_2038,0);
              local_2070[lVar26 * 6 + -1] = sVar9;
              local_2070[lVar26 * 6] = (long)(int)local_2038[0].st_dev;
            }
            goto LAB_00102c44;
          }
        }
LAB_00102d28:
        fprintf(_stderr,"%s: malloc failure\n",progname);
        goto LAB_00102d47;
      }
      local_2080[lVar26 * 6] = (void *)0x0;
    }
LAB_00102c44:
    if (lVar8 == 0) goto LAB_00102d1e;
LAB_00102c4d:
    if ((&pcStack_2088)[lVar26 * 6] != (char *)0x0) {
      qsort(local_2080[lVar26 * 6],(size_t)(&pcStack_2088)[lVar26 * 6],0x38,entry_cmp);
    }
    bVar27 = lVar26 == 0;
    lVar26 = lVar26 + 1;
  } while (bVar27);
  header_done = 0;
  local_2038[0].st_dev = (__dev_t)local_2080[0];
  local_2038[0].st_ino = local_2050;
  local_20d8 = pcStack_2088;
  check = (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0;
  local_20d0 = local_2058;
  if (paranoid != 0) {
    check = entry_paranoia_checks;
  }
  iVar5 = compare_list(local_20e8,(void **)local_2038,(zip_uint64_t *)&local_20d8,0x38,entry_cmp,
                       check,entry_print);
  if (paranoid != 0) {
    uVar7 = 1;
    if ((local_2070[0] == local_2040) && (uVar7 = 0, local_2070[0] != 0)) {
      if (local_2080[1] == (void *)0x0 || local_2048 == (void *)0x0) {
        uVar7 = (uint)(local_2080[1] == local_2048);
      }
      else {
        uVar7 = memcmp(local_2080[1],local_2048,local_2040);
      }
    }
    if ((uVar7 != 0) && (iVar5 = 1, verbose != 0)) {
      printf("--- archive comment (%zu)\n",local_2070[0]);
      printf("+++ archive comment (%zu)\n",local_2040);
    }
  }
  lVar26 = 0;
  do {
    if (local_2098[lVar26 * 6 + 1] != 0) {
      zip_close();
    }
    pcVar22 = (&pcStack_2088)[lVar26 * 6];
    if (pcVar22 != (char *)0x0) {
      puVar25 = (undefined8 *)local_2080[lVar26 * 6];
      do {
        free((void *)*puVar25);
        puVar25 = puVar25 + 7;
        pcVar22 = pcVar22 + -1;
      } while (pcVar22 != (char *)0x0);
    }
    free(local_2080[lVar26 * 6]);
    bVar27 = lVar26 == 0;
    lVar26 = lVar26 + 1;
  } while (bVar27);
  if (iVar5 == 1) {
LAB_00102d47:
    exit(1);
  }
  if (iVar5 == 0) {
    exit(0);
  }
LAB_00102d1e:
  exit(2);
}

Assistant:

static int
compare_zip(char *const zn[]) {
    struct archive a[2];
    struct entry *e[2];
    zip_uint64_t n[2];
    int i;
    int res;

    for (i = 0; i < 2; i++) {
	a[i].name = zn[i];
	a[i].entry = NULL;
	a[i].nentry = 0;
	a[i].za = NULL;
	a[i].comment = NULL;
	a[i].comment_length = 0;

	if (is_directory(zn[i])) {
#ifndef HAVE_FTS_H
	    fprintf(stderr, "%s: reading directories not supported\n", progname);
	    exit(2);
#else
	    if (list_directory(zn[i], a + i) < 0)
		exit(2);
	    paranoid = 0; /* paranoid checks make no sense for directories, since they compare zip metadata */
#endif
	}
	else {
	    if (list_zip(zn[i], a + i) < 0)
		exit(2);
	}
	if (a[i].nentry > 0)
	    qsort(a[i].entry, a[i].nentry, sizeof(a[i].entry[0]), entry_cmp);
    }

    header_done = 0;

    e[0] = a[0].entry;
    e[1] = a[1].entry;
    n[0] = a[0].nentry;
    n[1] = a[1].nentry;
    res = compare_list(zn, (const void **)e, n, sizeof(e[i][0]), entry_cmp, paranoid ? entry_paranoia_checks : NULL, entry_print);

    if (paranoid) {
	if (comment_compare(a[0].comment, a[0].comment_length, a[1].comment, a[1].comment_length) != 0) {
	    if (verbose) {
		printf("--- archive comment (%zu)\n", a[0].comment_length);
		printf("+++ archive comment (%zu)\n", a[1].comment_length);
	    }
	    res = 1;
	}
    }

    for (i = 0; i < 2; i++) {
	zip_uint64_t j;

	if (a[i].za) {
	    zip_close(a[i].za);
	}
	for (j = 0; j < a[i].nentry; j++) {
	    free(a[i].entry[j].name);
	}
	free(a[i].entry);
    }

    switch (res) {
    case 0:
	exit(0);

    case 1:
	exit(1);

    default:
	exit(2);
    }
}